

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence_lanscapes_on_grid_test.cpp
# Opt level: O2

void __thiscall check_construction_of_landscape::test_method(check_construction_of_landscape *this)

{
  shared_count sStack_f0;
  Persistence_landscape_on_grid g;
  Persistence_landscape_on_grid l;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  undefined **local_30;
  undefined1 local_28;
  undefined8 *local_20;
  char **local_18;
  
  Gudhi::Persistence_representations::Persistence_landscape_on_grid::Persistence_landscape_on_grid
            (&l,"data/file_with_diagram_1",100,0xffff);
  Gudhi::Persistence_representations::Persistence_landscape_on_grid::print_to_file
            (&l,"landscape_from_file_with_diagram_1");
  g.values_of_landscapes.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  g.number_of_functions_for_vectorization = 0;
  g.values_of_landscapes.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  g.values_of_landscapes.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  g.grid_min = 0.0;
  g.grid_max = 0.0;
  g.number_of_functions_for_projections_to_reals = 0;
  Gudhi::Persistence_representations::Persistence_landscape_on_grid::load_landscape_from_file
            (&g,"landscape_from_file_with_diagram_1");
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_lanscapes_on_grid_test.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x20);
  Gudhi::Persistence_representations::Persistence_landscape_on_grid::operator==(&l,&g);
  sStack_f0.pi_ = (sp_counted_base *)0x0;
  local_18 = &local_60;
  local_60 = "l == g";
  local_58 = "";
  local_28 = 0;
  local_30 = &PTR__lazy_ostream_00112d40;
  local_20 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_f0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&g.values_of_landscapes);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&l.values_of_landscapes);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_construction_of_landscape) {
  Persistence_landscape_on_grid l("data/file_with_diagram_1", 100, std::numeric_limits<unsigned short>::max());
  l.print_to_file("landscape_from_file_with_diagram_1");

  Persistence_landscape_on_grid g;
  g.load_landscape_from_file("landscape_from_file_with_diagram_1");

  BOOST_CHECK(l == g);
}